

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdm.cpp
# Opt level: O2

void __thiscall FDMEulerExplicit::set_initial_conditions(FDMEulerExplicit *this)

{
  unsigned_long j;
  ulong uVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar2 [16];
  double dVar3;
  value_type local_30;
  undefined1 local_28 [16];
  
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_FDMBase).old_result,(this->super_FDMBase).J,&local_30);
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_FDMBase).new_result,(this->super_FDMBase).J,&local_30);
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_FDMBase).x_values,(this->super_FDMBase).J,&local_30);
  for (uVar1 = 0; uVar1 < (this->super_FDMBase).J; uVar1 = uVar1 + 1) {
    auVar2._8_4_ = (int)(uVar1 >> 0x20);
    auVar2._0_8_ = uVar1;
    auVar2._12_4_ = 0x45300000;
    dVar3 = auVar2._8_8_ - 1.9342813113834067e+25;
    local_28._8_4_ = SUB84(dVar3,0);
    local_28._0_8_ =
         (dVar3 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) *
         (this->super_FDMBase).dx;
    local_28._12_4_ = (int)((ulong)dVar3 >> 0x20);
    (*((this->super_FDMBase).pde)->_vptr_ConvectionDiffusionPDE[6])();
    (this->super_FDMBase).old_result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar1] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    (this->super_FDMBase).x_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar1] = (double)local_28._0_8_;
  }
  (this->super_FDMBase).prev_t = 0.0;
  (this->super_FDMBase).cur_t = 0.0;
  return;
}

Assistant:

void FDMEulerExplicit::set_initial_conditions()
{
    double cur_spot = 0.0;

    old_result.resize(J, 0.0);
    new_result.resize(J, 0.0);
    x_values.resize(J, 0.0);

    for (unsigned long j=0; j<J; j++)
    {
        cur_spot = static_cast<double>(j)*dx;
        old_result[j] = pde->init_cond(cur_spot);
        x_values[j] = cur_spot;
    }

    prev_t = 0.0;
    cur_t = 0.0;
}